

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O3

void ssl_calc_verify_tls(mbedtls_ssl_context *ssl,uchar *hash)

{
  mbedtls_md5_context md5;
  mbedtls_sha1_context sha1;
  mbedtls_md5_context local_d4;
  mbedtls_sha1_context local_7c;
  
  mbedtls_md5_init(&local_d4);
  mbedtls_sha1_init(&local_7c);
  mbedtls_md5_clone(&local_d4,&ssl->handshake->fin_md5);
  mbedtls_sha1_clone(&local_7c,&ssl->handshake->fin_sha1);
  mbedtls_md5_finish_ret(&local_d4,hash);
  mbedtls_sha1_finish_ret(&local_7c,hash + 0x10);
  mbedtls_md5_free(&local_d4);
  mbedtls_sha1_free(&local_7c);
  return;
}

Assistant:

void ssl_calc_verify_tls( mbedtls_ssl_context *ssl, unsigned char hash[36] )
{
    mbedtls_md5_context md5;
    mbedtls_sha1_context sha1;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> calc verify tls" ) );

    mbedtls_md5_init( &md5 );
    mbedtls_sha1_init( &sha1 );

    mbedtls_md5_clone( &md5, &ssl->handshake->fin_md5 );
    mbedtls_sha1_clone( &sha1, &ssl->handshake->fin_sha1 );

     mbedtls_md5_finish_ret( &md5,  hash );
    mbedtls_sha1_finish_ret( &sha1, hash + 16 );

    MBEDTLS_SSL_DEBUG_BUF( 3, "calculated verify result", hash, 36 );
    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= calc verify" ) );

    mbedtls_md5_free(  &md5  );
    mbedtls_sha1_free( &sha1 );

    return;
}